

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_updateTree(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend)

{
  U32 mls;
  BYTE *pBVar1;
  U32 UVar2;
  uint uVar3;
  U32 UVar4;
  bool bVar5;
  
  mls = (ms->cParams).minMatch;
  pBVar1 = (ms->window).base;
  UVar4 = ms->nextToUpdate;
  while (uVar3 = (uint)((long)ip - (long)pBVar1), UVar4 < uVar3) {
    UVar2 = ZSTD_insertBt1(ms,pBVar1 + UVar4,iend,mls,0);
    bVar5 = UVar2 + UVar4 <= UVar4;
    UVar4 = UVar2 + UVar4;
    if (bVar5) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4786,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar1) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4789,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iend - (long)pBVar1) >> 0x20 == 0) {
    ms->nextToUpdate = uVar3;
    return;
  }
  __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x478a,
                "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
               );
}

Assistant:

void ZSTD_updateTree(ZSTD_matchState_t* ms, const BYTE* ip, const BYTE* iend) {
    ZSTD_updateTree_internal(ms, ip, iend, ms->cParams.minMatch, ZSTD_noDict);
}